

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void __thiscall
ncnn::Mat::create(Mat *this,int _w,int _h,int _d,int _c,size_t _elemsize,Allocator *_allocator)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  void *pvVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Mat *in_RDI;
  int in_R8D;
  size_t in_R9;
  Allocator *in_stack_00000008;
  size_t totalsize;
  
  if (((((in_RDI->dims != 4) || (in_RDI->w != in_ESI)) || (in_RDI->h != in_EDX)) ||
      ((in_RDI->d != in_ECX || (in_RDI->c != in_R8D)))) ||
     ((in_RDI->elemsize != in_R9 ||
      ((in_RDI->elempack != 1 || (in_RDI->allocator != in_stack_00000008)))))) {
    release(in_RDI);
    in_RDI->elemsize = in_R9;
    in_RDI->elempack = 1;
    in_RDI->allocator = in_stack_00000008;
    in_RDI->dims = 4;
    in_RDI->w = in_ESI;
    in_RDI->h = in_EDX;
    in_RDI->d = in_ECX;
    in_RDI->c = in_R8D;
    sVar2 = ncnn::alignSize((long)in_RDI->w * (long)in_RDI->h * (long)in_RDI->d * in_RDI->elemsize,
                            0x10);
    in_RDI->cstep = sVar2 / in_RDI->elemsize;
    sVar2 = total(in_RDI);
    if (sVar2 != 0) {
      sVar2 = total(in_RDI);
      sVar2 = ncnn::alignSize(sVar2 * in_RDI->elemsize,4);
      if (in_RDI->allocator == (Allocator *)0x0) {
        pvVar3 = fastMalloc((size_t)in_RDI);
        in_RDI->data = pvVar3;
      }
      else {
        iVar1 = (*in_RDI->allocator->_vptr_Allocator[2])(in_RDI->allocator,sVar2 + 4);
        in_RDI->data = (void *)CONCAT44(extraout_var,iVar1);
      }
      in_RDI->refcount = (int *)((long)in_RDI->data + sVar2);
      *in_RDI->refcount = 1;
    }
  }
  return;
}

Assistant:

void Mat::create(int _w, int _h, int _d, int _c, size_t _elemsize, Allocator* _allocator)
{
    if (dims == 4 && w == _w && h == _h && d == _d && c == _c && elemsize == _elemsize && elempack == 1 && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = 1;
    allocator = _allocator;

    dims = 4;
    w = _w;
    h = _h;
    d = _d;
    c = _c;

    cstep = alignSize((size_t)w * h * d * elemsize, 16) / elemsize;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}